

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Ptr<Catch::IStreamingReporter>
Catch::createReporter(string *reporterName,Ptr<Catch::Config> *config)

{
  string *psVar1;
  bool bVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  domain_error *this;
  Ptr<Catch::Config> *in_RDX;
  string *in_RSI;
  Ptr<Catch::IStreamingReporter> *in_RDI;
  ostringstream oss;
  Ptr<Catch::IStreamingReporter> *reporter;
  IStreamingReporter *in_stack_fffffffffffffdd8;
  Ptr<const_Catch::IConfig> *in_stack_fffffffffffffde0;
  string local_1d0 [32];
  ostringstream local_1b0 [392];
  undefined1 local_28 [15];
  undefined1 local_19;
  Ptr<Catch::Config> *local_18;
  string *local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[2])();
  psVar1 = local_10;
  Ptr<Catch::Config>::get(local_18);
  Ptr<const_Catch::IConfig>::Ptr(in_stack_fffffffffffffde0,(IConfig *)in_stack_fffffffffffffdd8);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar3),psVar1,local_28);
  Ptr<Catch::IStreamingReporter>::Ptr
            ((Ptr<Catch::IStreamingReporter> *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  Ptr<const_Catch::IConfig>::~Ptr(in_stack_fffffffffffffde0);
  bVar2 = Ptr<Catch::IStreamingReporter>::operator!(in_RDI);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar5 = std::operator<<((ostream *)local_1b0,"No reporter registered with name: \'");
    poVar5 = std::operator<<(poVar5,local_10);
    std::operator<<(poVar5,"\'");
    this = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::domain_error::domain_error(this,local_1d0);
    __cxa_throw(this,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)in_RDI;
}

Assistant:

Ptr<IStreamingReporter> createReporter( std::string const& reporterName, Ptr<Config> const& config ) {
        Ptr<IStreamingReporter> reporter = getRegistryHub().getReporterRegistry().create( reporterName, config.get() );
        if( !reporter ) {
            std::ostringstream oss;
            oss << "No reporter registered with name: '" << reporterName << "'";
            throw std::domain_error( oss.str() );
        }
        return reporter;
    }